

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  FP *pFVar1;
  double dVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  MomentumType local_78;
  ParticleType particle;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this);
  local_78.x = 5243.1654;
  local_78.y = -5623000.0;
  local_78.z = -0.0065237;
  pica::Particle<(pica::Dimension)3>::setVelocity(&particle,&local_78);
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  dVar6 = particle.invGamma * 29979245800.0;
  dVar4 = SQRT(local_78.z * local_78.z + local_78.x * local_78.x + local_78.y * local_78.y);
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
            maxAbsoluteError;
  dVar2 = local_78.x - particle.p.x * dVar6;
  dVar5 = local_78.y - particle.p.y * dVar6;
  dVar6 = local_78.z - dVar6 * particle.p.z;
  local_98.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       SQRT(dVar6 * dVar6 + dVar2 * dVar2 + dVar5 * dVar5);
  if (dVar4 < *pFVar1 || dVar4 == *pFVar1) {
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&gtest_ar,"dist(newVelocity, particle.getVelocity())",
               "this->maxAbsoluteError",(double *)&local_98,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
                maxAbsoluteError);
    if (gtest_ar.success_ != false) goto LAB_00197158;
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
  }
  else {
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((double)local_98.ptr_ / dVar4);
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&gtest_ar,
               "dist(newVelocity, particle.getVelocity()) / newVelocity.norm()",
               "this->maxRelativeError",(double *)&local_98,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
                maxRelativeError);
    if (gtest_ar.success_ != false) goto LAB_00197158;
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_98);
LAB_00197158:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetVelocity)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;

    ParticleType particle = this->randomParticle();
    MomentumType newVelocity(5243.1654, -56.23e5, -65.237e-4);
    particle.setVelocity(newVelocity);
    this->maxRelativeError = 1e-12;
    MomentumType v = particle.getVelocity();
    ASSERT_NEAR_VECTOR(newVelocity, particle.getVelocity());
}